

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snake.cpp
# Opt level: O0

void __thiscall
Snake::UpdateBody(Snake *this,SDL_Point *current_head_cell,SDL_Point *prev_head_cell,
                 Snake *otherSnake)

{
  bool bVar1;
  reference pSVar2;
  ostream *this_00;
  SDL_Point *item_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<SDL_Point,_std::allocator<SDL_Point>_> *__range1_1;
  SDL_Point *item;
  iterator __end1;
  iterator __begin1;
  vector<SDL_Point,_std::allocator<SDL_Point>_> *__range1;
  __normal_iterator<SDL_Point_*,_std::vector<SDL_Point,_std::allocator<SDL_Point>_>_> local_38;
  const_iterator local_30;
  Snake *local_28;
  Snake *otherSnake_local;
  SDL_Point *prev_head_cell_local;
  SDL_Point *current_head_cell_local;
  Snake *this_local;
  
  local_28 = otherSnake;
  otherSnake_local = (Snake *)prev_head_cell;
  prev_head_cell_local = current_head_cell;
  current_head_cell_local = (SDL_Point *)this;
  std::vector<SDL_Point,_std::allocator<SDL_Point>_>::push_back(&this->body,prev_head_cell);
  if ((this->growing & 1U) == 0) {
    local_38._M_current =
         (SDL_Point *)std::vector<SDL_Point,_std::allocator<SDL_Point>_>::begin(&this->body);
    __gnu_cxx::__normal_iterator<SDL_Point_const*,std::vector<SDL_Point,std::allocator<SDL_Point>>>
    ::__normal_iterator<SDL_Point*>
              ((__normal_iterator<SDL_Point_const*,std::vector<SDL_Point,std::allocator<SDL_Point>>>
                *)&local_30,&local_38);
    std::vector<SDL_Point,_std::allocator<SDL_Point>_>::erase(&this->body,local_30);
  }
  else {
    this->growing = false;
    this->size = this->size + 1;
  }
  __end1 = std::vector<SDL_Point,_std::allocator<SDL_Point>_>::begin(&this->body);
  item = (SDL_Point *)std::vector<SDL_Point,_std::allocator<SDL_Point>_>::end(&this->body);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<SDL_Point_*,_std::vector<SDL_Point,_std::allocator<SDL_Point>_>_>
                                *)&item);
    if (!bVar1) break;
    pSVar2 = __gnu_cxx::
             __normal_iterator<SDL_Point_*,_std::vector<SDL_Point,_std::allocator<SDL_Point>_>_>::
             operator*(&__end1);
    if ((prev_head_cell_local->x == pSVar2->x) && (prev_head_cell_local->y == pSVar2->y)) {
      this->alive = false;
    }
    __gnu_cxx::__normal_iterator<SDL_Point_*,_std::vector<SDL_Point,_std::allocator<SDL_Point>_>_>::
    operator++(&__end1);
  }
  __end1_1 = std::vector<SDL_Point,_std::allocator<SDL_Point>_>::begin(&otherSnake->body);
  item_1 = (SDL_Point *)std::vector<SDL_Point,_std::allocator<SDL_Point>_>::end(&otherSnake->body);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<SDL_Point_*,_std::vector<SDL_Point,_std::allocator<SDL_Point>_>_>
                        *)&item_1);
    if (!bVar1) break;
    pSVar2 = __gnu_cxx::
             __normal_iterator<SDL_Point_*,_std::vector<SDL_Point,_std::allocator<SDL_Point>_>_>::
             operator*(&__end1_1);
    if ((prev_head_cell_local->x == pSVar2->x) && (prev_head_cell_local->y == pSVar2->y)) {
      this->alive = false;
    }
    __gnu_cxx::__normal_iterator<SDL_Point_*,_std::vector<SDL_Point,_std::allocator<SDL_Point>_>_>::
    operator++(&__end1_1);
  }
  if ((prev_head_cell_local->x == (int)otherSnake->head_x) &&
     (prev_head_cell_local->y == (int)otherSnake->head_y)) {
    this_00 = std::operator<<((ostream *)&std::cout,"snakes collided");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    this->alive = false;
  }
  return;
}

Assistant:

void Snake::UpdateBody(SDL_Point &current_head_cell, SDL_Point &prev_head_cell, Snake otherSnake) {
  // Add previous head location to vector
  body.push_back(prev_head_cell);

  if (!growing) {
    // Remove the tail from the vector.
    body.erase(body.begin());
  } else {
    growing = false;
    size++;
  }
  
  // Check if the snake has died.
  /*hiiting himself*/
  for (auto const &item : body) {
    if (current_head_cell.x == static_cast<int>(item.x) && current_head_cell.y == static_cast<int>(item.y)) {
      alive = false;
    }
  }
  
  /*hiiting otherSanke's body*/
  for (auto const &item : otherSnake.body) {
   if (current_head_cell.x == item.x && current_head_cell.y == item.y) {
      alive = false;
    }
  }
  
  /*hiiting otherSanke's head*/
  if (current_head_cell.x == static_cast<int>(otherSnake.head_x) && current_head_cell.y == static_cast<int>(otherSnake.head_y)) {
      std::cout << "snakes collided" << std::endl;
      alive = false;
  }
}